

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_LayoutData.H
# Opt level: O2

void __thiscall
amrex::LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*>::~LayoutData
          (LayoutData<amrex::GpuArray<amrex::MLCellLinOp::BCTL,_6U>_*> *this)

{
  ~LayoutData(this);
  operator_delete(this,0x110);
  return;
}

Assistant:

~LayoutData () { if (m_need_to_clear_bd) clearThisBD(); }